

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::
     _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char cVar3;
  
  __stream = (FILE *)in;
  uVar1 = _parse_quadhex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((picojson *)in,in);
  if (uVar1 == 0xffffffff) {
    return false;
  }
  cVar3 = (char)out;
  if ((uVar1 & 0xfffff800) == 0xd800) {
    if (0xdbff < uVar1) {
      return false;
    }
    iVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc(in,__stream);
    if ((iVar2 != 0x5c) ||
       (iVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::getc(in,__stream), iVar2 != 0x75)) {
      in->consumed_ = false;
      return false;
    }
    uVar1 = _parse_quadhex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((picojson *)in,
                       (input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__stream);
    if ((uVar1 & 0xfffffc00) != 0xdc00) {
      return false;
    }
LAB_0010779a:
    std::__cxx11::string::push_back(cVar3);
LAB_001077b7:
    std::__cxx11::string::push_back(cVar3);
  }
  else {
    if ((int)uVar1 < 0x80) goto LAB_001077df;
    if (0x7ff < uVar1) {
      if (0xffff < uVar1) goto LAB_0010779a;
      goto LAB_001077b7;
    }
  }
  std::__cxx11::string::push_back(cVar3);
LAB_001077df:
  std::__cxx11::string::push_back(cVar3);
  return true;
}

Assistant:

inline bool _parse_codepoint(String &out, input<Iter> &in) {
  int uni_ch;
  if ((uni_ch = _parse_quadhex(in)) == -1) {
    return false;
  }
  if (0xd800 <= uni_ch && uni_ch <= 0xdfff) {
    if (0xdc00 <= uni_ch) {
      // a second 16-bit of a surrogate pair appeared
      return false;
    }
    // first 16-bit of surrogate pair, get the next one
    if (in.getc() != '\\' || in.getc() != 'u') {
      in.ungetc();
      return false;
    }
    int second = _parse_quadhex(in);
    if (!(0xdc00 <= second && second <= 0xdfff)) {
      return false;
    }
    uni_ch = ((uni_ch - 0xd800) << 10) | ((second - 0xdc00) & 0x3ff);
    uni_ch += 0x10000;
  }
  if (uni_ch < 0x80) {
    out.push_back(static_cast<char>(uni_ch));
  } else {
    if (uni_ch < 0x800) {
      out.push_back(static_cast<char>(0xc0 | (uni_ch >> 6)));
    } else {
      if (uni_ch < 0x10000) {
        out.push_back(static_cast<char>(0xe0 | (uni_ch >> 12)));
      } else {
        out.push_back(static_cast<char>(0xf0 | (uni_ch >> 18)));
        out.push_back(static_cast<char>(0x80 | ((uni_ch >> 12) & 0x3f)));
      }
      out.push_back(static_cast<char>(0x80 | ((uni_ch >> 6) & 0x3f)));
    }
    out.push_back(static_cast<char>(0x80 | (uni_ch & 0x3f)));
  }
  return true;
}